

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O2

TConstUnion __thiscall glslang::TConstUnion::operator%(TConstUnion *this,TConstUnion *constant)

{
  TBasicType TVar1;
  uint uVar2;
  ushort uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  TConstUnion TVar7;
  
  TVar1 = this->type;
  if (TVar1 != constant->type) {
    __assert_fail("type == constant.type",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                  ,0x1f5,"TConstUnion glslang::TConstUnion::operator%(const TConstUnion &) const");
  }
  switch(TVar1) {
  case EbtInt8:
    uVar4 = (ulong)(ushort)((short)(this->field_0).i8Const % (short)(constant->field_0).i8Const);
    goto LAB_0036f859;
  case EbtUint8:
    uVar4 = (ulong)((this->field_0).u8Const % (constant->field_0).u8Const);
LAB_0036f859:
    uVar2 = 0;
LAB_0036f85b:
    uVar5 = 0;
    break;
  case EbtInt16:
    uVar4 = (long)(int)(this->field_0).i16Const % (long)(int)(constant->field_0).i16Const &
            0xffffffff;
    uVar2 = (uint)(uVar4 >> 8);
    goto LAB_0036f85b;
  case EbtUint16:
    uVar5 = 0;
    uVar3 = (this->field_0).u16Const % (constant->field_0).u16Const;
    uVar4 = (ulong)uVar3;
    uVar2 = (uint)(uVar3 >> 8);
    break;
  case EbtInt:
    uVar6 = (long)(this->field_0).iConst % (long)(constant->field_0).iConst;
    uVar4 = uVar6 & 0xffffffff;
    uVar2 = (uint)(uVar4 >> 8);
    uVar5 = (uint)(uVar6 >> 0x10) & 0xffff;
    break;
  case EbtUint:
    uVar6 = 0;
    uVar4 = (ulong)(this->field_0).uConst % (ulong)(constant->field_0).uConst;
    uVar2 = (uint)(uVar4 >> 8);
    uVar5 = (uint)(uVar4 >> 0x10);
    goto LAB_0036f898;
  case EbtInt64:
    uVar4 = (this->field_0).i64Const % (constant->field_0).i64Const;
    goto LAB_0036f87f;
  case EbtUint64:
    uVar4 = (this->field_0).u64Const % (constant->field_0).u64Const;
LAB_0036f87f:
    uVar2 = (uint)(uVar4 >> 8) & 0xffffff;
    uVar5 = (uint)(uVar4 >> 0x10);
    uVar6 = uVar4 & 0xffffffff00000000;
    goto LAB_0036f898;
  default:
    __assert_fail("false && \"Default missing\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                  ,0x1ff,"TConstUnion glslang::TConstUnion::operator%(const TConstUnion &) const");
  }
  uVar6 = 0;
LAB_0036f898:
  TVar7.field_0 = ((uint)uVar4 & 0xff | (uVar2 & 0xff) << 8 | uVar5 << 0x10) | uVar6;
  TVar7.type = TVar1;
  TVar7._12_4_ = 0;
  return TVar7;
}

Assistant:

TConstUnion operator%(const TConstUnion& constant) const
    {
        TConstUnion returnValue;
        assert(type == constant.type);
        switch (type) {
        case EbtInt:    returnValue.setIConst(iConst % constant.iConst); break;
        case EbtUint:   returnValue.setUConst(uConst % constant.uConst); break;
        case EbtInt8:   returnValue.setI8Const(i8Const % constant.i8Const); break;
        case EbtInt16:  returnValue.setI16Const(i16Const % constant.i16Const); break;
        case EbtInt64:  returnValue.setI64Const(i64Const % constant.i64Const); break;
        case EbtUint8:  returnValue.setU8Const(u8Const % constant.u8Const); break;
        case EbtUint16: returnValue.setU16Const(u16Const % constant.u16Const); break;
        case EbtUint64: returnValue.setU64Const(u64Const % constant.u64Const); break;
        default:     assert(false && "Default missing");
        }

        return returnValue;
    }